

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaTests.cc
# Opt level: O0

void avro::schema::testCompile(char *schema)

{
  basic_wrap_stringstream<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char **in_stack_fffffffffffffdb8;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffdc0;
  std_string *in_stack_fffffffffffffdc8;
  basic_wrap_stringstream<char> *this_00;
  const_string *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  const_string *in_stack_fffffffffffffe08;
  unit_test_log_t *in_stack_fffffffffffffe10;
  string local_1e0 [32];
  basic_wrap_stringstream<char> local_1c0;
  basic_cstring<const_char> local_18;
  
  this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
             ,0x6e);
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffffdc0);
  __a = boost::basic_wrap_stringstream<char>::ref(&local_1c0);
  boost::operator<<(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,in_stack_fffffffffffffdc8);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffffdc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,(allocator<char> *)__a);
  avro::compileJsonSchemaFromString(local_1e0);
  ValidSchema::~ValidSchema((ValidSchema *)0x209fd1);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdff);
  return;
}

Assistant:

static void testCompile(const char* schema)
{
    BOOST_TEST_CHECKPOINT(schema);
    compileJsonSchemaFromString(std::string(schema));
}